

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dictionary.h
# Opt level: O1

RecyclerWeakReference<const_Js::FunctionBody> * __thiscall
JsUtil::
WeaklyReferencedKeyDictionary<const_Js::FunctionBody,_Js::ScriptContext::RejitStats_*,_DefaultComparer<const_Js::FunctionBody_*>,_true>
::Insert(WeaklyReferencedKeyDictionary<const_Js::FunctionBody,_Js::ScriptContext::RejitStats_*,_DefaultComparer<const_Js::FunctionBody_*>,_true>
         *this,FunctionBody *key,RejitStats *value,bool add,bool checkForExisting)

{
  uint uVar1;
  WeakRefDictionaryEntry<const_Js::FunctionBody,_Memory::WriteBarrierPtr<Js::ScriptContext::RejitStats>_>
  *pWVar2;
  FunctionBody *pFVar3;
  Recycler *recycler;
  hash_t bucket;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  RejitStats *pRVar6;
  undefined4 extraout_var_00;
  RecyclerWeakReferenceBase *weakRef;
  RecyclerWeakReference<const_Js::FunctionBody> *pRVar7;
  WriteBarrierPtr<Js::ScriptContext::RejitStats> *addr;
  RejitStats *pRVar8;
  uint key_00;
  byte bVar9;
  
  if ((this->buckets).ptr == (int *)0x0) {
    Initialize(this,0);
  }
  key_00 = (uint)((ulong)key >> 3) | 1;
  bucket = PrimePolicy::ModPrime(key_00,this->size,this->modFunctionIndex);
  pRVar7 = (RecyclerWeakReference<const_Js::FunctionBody> *)CONCAT44(extraout_var,bucket);
  if (!checkForExisting) goto LAB_007add37;
  if ((this->buckets).ptr == (int *)0x0) {
LAB_007adcc3:
    iVar5 = -1;
  }
  else {
    Memory::Recycler::IsSweeping(this->recycler);
    uVar1 = (this->buckets).ptr[bucket];
    pRVar6 = (RejitStats *)(ulong)uVar1;
    pRVar8 = value;
    if ((int)uVar1 < 0) {
      pRVar7 = (RecyclerWeakReference<const_Js::FunctionBody> *)
               CONCAT71((uint7)(uint3)(uVar1 >> 8),1);
    }
    else {
      iVar5 = -1;
      do {
        pWVar2 = (this->entries).ptr;
        if (pWVar2[(ulong)pRVar6 & 0xffffffff].hash == key_00) {
          pFVar3 = (FunctionBody *)
                   ((pWVar2[(ulong)pRVar6 & 0xffffffff].key.ptr)->super_RecyclerWeakReferenceBase).
                   strongRef;
          if (pFVar3 == (FunctionBody *)0x0) {
            iVar4 = RemoveEntry(this,(int)pRVar6,iVar5,bucket);
            pRVar6 = (RejitStats *)CONCAT44(extraout_var_00,iVar4);
            bVar9 = 3;
          }
          else {
            bVar9 = pFVar3 == key;
            if ((bool)bVar9) {
              pRVar8 = pRVar6;
            }
            pRVar8 = (RejitStats *)((ulong)pRVar8 & 0xffffffff);
          }
          if (bVar9 == 0) goto LAB_007adc9b;
          if (bVar9 != 3) goto LAB_007adcb5;
        }
        else {
LAB_007adc9b:
          iVar5 = (int)pRVar6;
          pRVar6 = (RejitStats *)(ulong)(uint)(this->entries).ptr[iVar5].next;
        }
      } while (-1 < (int)pRVar6);
      bVar9 = 0;
LAB_007adcb5:
      pRVar7 = (RecyclerWeakReference<const_Js::FunctionBody> *)
               CONCAT71((int7)((ulong)pRVar6 >> 8),(bVar9 & 1) == 0);
    }
    iVar5 = (int)pRVar8;
    if ((char)pRVar7 != '\0') goto LAB_007adcc3;
  }
  if (iVar5 != -1) {
    if (add) {
      Js::Throw::FatalInternalError(-0x7fffbffb);
    }
    addr = &(this->entries).ptr[iVar5].value;
    Memory::Recycler::WBSetBit((char *)addr);
    addr->ptr = value;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    this->version = this->version + 1;
    pRVar7 = (this->entries).ptr[iVar5].key.ptr;
  }
  if (iVar5 != -1) {
    return pRVar7;
  }
LAB_007add37:
  recycler = this->recycler;
  weakRef = Memory::WeakReferenceHashTable<PrimePolicy>::Add
                      (&recycler->weakReferenceMap,(char *)key,recycler);
  if (weakRef->typeInfo == (Type)0x0) {
    weakRef->typeInfo = (Type)&Js::FunctionBody::typeinfo;
    Memory::Recycler::TrackAllocWeakRef(recycler,weakRef);
  }
  pRVar7 = Insert(this,(RecyclerWeakReference<const_Js::FunctionBody> *)weakRef,value,key_00,bucket)
  ;
  return pRVar7;
}

Assistant:

const RecyclerWeakReference<TKey>* Insert(TKey* key, TValue value, bool add, bool checkForExisting = true)
        {
            if (buckets == nullptr) Initialize(0);

            hash_t hash = GetHashCode(key);
            uint bucket = PrimePolicy::GetBucket(hash, size, modFunctionIndex);

            if (checkForExisting)
            {
                int previous = -1;
                int i = FindEntry(key, hash, bucket, previous);

                if (i != -1)
                {
                    if (add)
                    {
                        Js::Throw::FatalInternalError();
                    }

                    entries[i].value = value;
                    version++;
                    return entries[i].key;
                }
            }

            // We know we need to insert- so first try creating the weak reference, before adding it to
            // the dictionary. If we OOM here, we still leave the dictionary as we found it.
            const RecyclerWeakReference<TKey>* weakRef = recycler->CreateWeakReferenceHandle<TKey>(key);

            return Insert(weakRef, value, hash, bucket);
        }